

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O1

ConstantInt * LLVMBC::dyn_cast<LLVMBC::ConstantInt>(Value *value)

{
  ValueKind VVar1;
  Value *this;
  Value *pVVar2;
  
  if (value != (Value *)0x0) {
    this = Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind(this);
    pVVar2 = (Value *)0x0;
    if (VVar1 == ConstantInt) {
      pVVar2 = this;
    }
    return (ConstantInt *)pVVar2;
  }
  return (ConstantInt *)0x0;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}